

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::anon_unknown_0::DumpAll
               (CordRep *rep,bool include_contents,ostream *stream,size_t depth)

{
  size_type __n;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  iterator ppCVar5;
  CordRepSubstring *pCVar6;
  CordRepFlat *this;
  AlphaNum *in_R8;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> SVar7;
  CordRepSubstring *substring;
  CordRep *edge;
  iterator __end4;
  iterator __begin4;
  size_type local_2b0;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_2a8;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4;
  AlphaNum local_298;
  AlphaNum local_268;
  AlphaNum local_238;
  undefined1 local_208 [8];
  string label;
  CordRepBtree *node;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  anon_class_16_2_6856332a maybe_dump_data;
  Hex local_180;
  AlphaNum local_170;
  AlphaNum local_140;
  undefined1 local_110 [8];
  string sptr;
  AlphaNum local_c0;
  AlphaNum local_90;
  byte local_4a;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string sharing;
  size_t depth_local;
  ostream *stream_local;
  bool include_contents_local;
  CordRep *rep_local;
  
  sharing.field_2._8_8_ = depth;
  if (0xe < depth) {
    __assert_fail("depth <= CordRepBtree::kMaxDepth + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x40,
                  "void absl::cord_internal::(anonymous namespace)::DumpAll(const CordRep *, bool, std::ostream &, size_t)"
                 );
  }
  bVar1 = RefcountAndFlags::IsOne(&rep->refcount);
  local_4a = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"Private",&local_49);
  }
  else {
    AlphaNum::AlphaNum(&local_90,"Shared(");
    sVar3 = RefcountAndFlags::Get(&rep->refcount);
    AlphaNum::AlphaNum(&local_c0,sVar3);
    AlphaNum::AlphaNum((AlphaNum *)((long)&sptr.field_2 + 8),")");
    depth = (long)&sptr.field_2 + 8;
    StrCat_abi_cxx11_((string *)local_48,(lts_20250127 *)&local_90,&local_c0,(AlphaNum *)depth,in_R8
                     );
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  AlphaNum::AlphaNum(&local_140,"0x");
  Hex::Hex<absl::lts_20250127::cord_internal::CordRep_const>(&local_180,rep,kNoPad);
  maybe_dump_data.include_contents = false;
  maybe_dump_data._9_7_ = 0;
  strings_internal::StringifySink::StringifySink((StringifySink *)&maybe_dump_data.include_contents)
  ;
  AlphaNum::AlphaNum<absl::lts_20250127::Hex,void>
            (&local_170,&local_180,(StringifySink *)&maybe_dump_data.include_contents);
  StrCat_abi_cxx11_((string *)local_110,(lts_20250127 *)&local_140,&local_170,(AlphaNum *)depth);
  strings_internal::StringifySink::~StringifySink
            ((StringifySink *)&maybe_dump_data.include_contents);
  __n = sharing.field_2._8_8_ * 2;
  local_1b8 = (undefined1  [8])stream;
  maybe_dump_data.stream._0_1_ = include_contents;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,__n,' ',(allocator<char> *)((long)&node + 7));
  poVar4 = std::operator<<(stream,local_1d8);
  poVar4 = std::operator<<(poVar4,(string *)local_48);
  poVar4 = std::operator<<(poVar4," (");
  poVar4 = std::operator<<(poVar4,(string *)local_110);
  std::operator<<(poVar4,") ");
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&node + 7));
  bVar1 = CordRep::IsBtree(rep);
  if (bVar1) {
    label.field_2._8_8_ = CordRep::btree(rep);
    iVar2 = CordRepBtree::height((CordRepBtree *)label.field_2._8_8_);
    __range4._6_1_ = 0;
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      __range4._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,"Leaf",(allocator<char> *)((long)&__range4 + 7));
    }
    else {
      AlphaNum::AlphaNum(&local_238,"Node(");
      iVar2 = CordRepBtree::height((CordRepBtree *)label.field_2._8_8_);
      AlphaNum::AlphaNum(&local_268,iVar2);
      AlphaNum::AlphaNum(&local_298,")");
      StrCat_abi_cxx11_((string *)local_208,(lts_20250127 *)&local_238,&local_268,&local_298,in_R8);
    }
    if ((__range4._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
    }
    poVar4 = std::operator<<(stream,(string *)local_208);
    poVar4 = std::operator<<(poVar4,", len = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)label.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,", begin = ");
    sVar3 = CordRepBtree::begin((CordRepBtree *)label.field_2._8_8_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    poVar4 = std::operator<<(poVar4,", end = ");
    sVar3 = CordRepBtree::end((CordRepBtree *)label.field_2._8_8_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    std::operator<<(poVar4,"\n");
    SVar7 = CordRepBtree::Edges((CordRepBtree *)label.field_2._8_8_);
    local_2b0 = SVar7.len_;
    __begin4 = SVar7.ptr_;
    local_2a8 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4;
    __end4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_2a8);
    ppCVar5 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_2a8);
    for (; __end4 != ppCVar5; __end4 = __end4 + 1) {
      DumpAll(*__end4,include_contents,stream,sharing.field_2._8_8_ + 1);
    }
    std::__cxx11::string::~string((string *)local_208);
  }
  else if (rep->tag == '\x01') {
    pCVar6 = CordRep::substring(rep);
    poVar4 = std::operator<<(stream,"Substring, len = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,rep->length);
    poVar4 = std::operator<<(poVar4,", start = ");
    std::ostream::operator<<(poVar4,pCVar6->start);
    DumpAll::anon_class_16_2_6856332a::operator()((anon_class_16_2_6856332a *)local_1b8,rep);
    DumpAll(pCVar6->child,include_contents,stream,sharing.field_2._8_8_ + 1);
  }
  else if (rep->tag < 6) {
    if (rep->tag == '\x05') {
      poVar4 = std::operator<<(stream,"Extn, len = ");
      std::ostream::operator<<(poVar4,rep->length);
      DumpAll::anon_class_16_2_6856332a::operator()((anon_class_16_2_6856332a *)local_1b8,rep);
    }
  }
  else {
    poVar4 = std::operator<<(stream,"Flat, len = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,rep->length);
    poVar4 = std::operator<<(poVar4,", cap = ");
    this = CordRep::flat(rep);
    sVar3 = CordRepFlat::Capacity(this);
    std::ostream::operator<<(poVar4,sVar3);
    DumpAll::anon_class_16_2_6856332a::operator()((anon_class_16_2_6856332a *)local_1b8,rep);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void DumpAll(const CordRep* rep,
             bool include_contents,
             std::ostream& stream,
             size_t depth = 0) {
  // Allow for full height trees + substring -> flat / external nodes.
  assert(depth <= CordRepBtree::kMaxDepth + 2);
  std::string sharing = const_cast<CordRep*>(rep)->refcount.IsOne()
                            ? std::string("Private")
                            : absl::StrCat("Shared(", rep->refcount.Get(), ")");
  std::string sptr = absl::StrCat("0x", absl::Hex(rep));

  // Dumps the data contents of `rep` if `include_contents` is true.
  // Always emits a new line character.
  auto maybe_dump_data = [&stream, include_contents](const CordRep* r) {
    if (include_contents) {
      // Allow for up to 60 wide display of content data, which with some
      // indentation and prefix / labels keeps us within roughly 80-100 wide.
      constexpr size_t kMaxDataLength = 60;
      stream << ", data = \""
             << EdgeData(r).substr(0, kMaxDataLength)
             << (r->length > kMaxDataLength ? "\"..." : "\"");
    }
    stream << '\n';
  };

  // For each level, we print the 'shared/private' state and the rep pointer,
  // indented by two spaces per recursive depth.
  stream << std::string(depth * 2, ' ') << sharing << " (" << sptr << ") ";

  if (rep->IsBtree()) {
    const CordRepBtree* node = rep->btree();
    std::string label =
        node->height() ? absl::StrCat("Node(", node->height(), ")") : "Leaf";
    stream << label << ", len = " << node->length
           << ", begin = " << node->begin() << ", end = " << node->end()
           << "\n";
    for (CordRep* edge : node->Edges()) {
      DumpAll(edge, include_contents, stream, depth + 1);
    }
  } else if (rep->tag == SUBSTRING) {
    const CordRepSubstring* substring = rep->substring();
    stream << "Substring, len = " << rep->length
           << ", start = " << substring->start;
    maybe_dump_data(rep);
    DumpAll(substring->child, include_contents, stream, depth + 1);
  } else if (rep->tag >= FLAT) {
    stream << "Flat, len = " << rep->length
           << ", cap = " << rep->flat()->Capacity();
    maybe_dump_data(rep);
  } else if (rep->tag == EXTERNAL) {
    stream << "Extn, len = " << rep->length;
    maybe_dump_data(rep);
  }
}